

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext.cc
# Opt level: O2

void __thiscall fasttext::FastText::trainThread(FastText *this,int32_t threadId)

{
  double dVar1;
  model_name mVar2;
  element_type *peVar3;
  int32_t iVar4;
  int64_t iVar5;
  long lVar6;
  Dictionary *this_00;
  float progress;
  float lr;
  real rVar7;
  vector<int,_std::allocator<int>_> line;
  __shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2> local_368;
  __shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2> local_358;
  __shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2> local_348;
  vector<int,_std::allocator<int>_> labels;
  Model model;
  ifstream ifs;
  
  std::ifstream::ifstream
            (&ifs,(string *)
                  (this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr,_S_in);
  iVar5 = utils::size(&ifs);
  utils::seek(&ifs,(iVar5 * threadId) /
                   (long)((this->args_).
                          super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                         thread);
  std::__shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_348,
             &(this->input_).super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_358,
             &(this->output_).super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_368,(__shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2> *)this);
  Model::Model(&model,(shared_ptr<fasttext::Matrix> *)&local_348,
               (shared_ptr<fasttext::Matrix> *)&local_358,(shared_ptr<fasttext::Args> *)&local_368,
               threadId);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_368._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_358._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_348._M_refcount);
  if (((this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->model
      == sup) {
    Dictionary::getCounts
              ((vector<long,_std::allocator<long>_> *)&line,
               (this->dict_).super___shared_ptr<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr,label);
    Model::setTargetCounts(&model,(vector<long,_std::allocator<long>_> *)&line);
  }
  else {
    Dictionary::getCounts
              ((vector<long,_std::allocator<long>_> *)&line,
               (this->dict_).super___shared_ptr<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr,word);
    Model::setTargetCounts(&model,(vector<long,_std::allocator<long>_> *)&line);
  }
  std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base
            ((_Vector_base<long,_std::allocator<long>_> *)&line);
  iVar5 = Dictionary::ntokens((this->dict_).
                              super___shared_ptr<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr);
  line.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  line.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  line.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  labels.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  labels.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  labels.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  lVar6 = 0;
  while (peVar3 = (this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr, (this->tokenCount).super___atomic_base<long>._M_i < peVar3->epoch * iVar5)
  {
    peVar3 = (this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    progress = (float)(this->tokenCount).super___atomic_base<long>._M_i /
               (float)(peVar3->epoch * iVar5);
    dVar1 = peVar3->lr;
    iVar4 = Dictionary::getLine((this->dict_).
                                super___shared_ptr<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2>
                                ._M_ptr,(istream *)&ifs,&line,&labels,&model.rng);
    lr = (float)((1.0 - (double)progress) * dVar1);
    peVar3 = (this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    mVar2 = peVar3->model;
    if (mVar2 == cbow) {
      cbow(this,&model,lr,&line);
    }
    else if (mVar2 == sg) {
      skipgram(this,&model,lr,&line);
    }
    else if (mVar2 == sup) {
      this_00 = (this->dict_).super___shared_ptr<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr;
      Dictionary::addNgrams(this_00,&line,peVar3->wordNgrams);
      supervised((FastText *)this_00,&model,lr,&line,&labels);
    }
    lVar6 = lVar6 + iVar4;
    if (((this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
        lrUpdateRate < lVar6) {
      LOCK();
      (this->tokenCount).super___atomic_base<long>._M_i =
           (this->tokenCount).super___atomic_base<long>._M_i + lVar6;
      UNLOCK();
      lVar6 = 0;
      if ((threadId == 0) &&
         (lVar6 = 0,
         1 < ((this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
             verbose)) {
        rVar7 = Model::getLoss(&model);
        printInfo(this,progress,rVar7);
        lVar6 = 0;
      }
    }
  }
  if ((threadId == 0) && (0 < peVar3->verbose)) {
    rVar7 = Model::getLoss(&model);
    printInfo(this,1.0,rVar7);
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  }
  std::ifstream::close();
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&labels.super__Vector_base<int,_std::allocator<int>_>);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&line.super__Vector_base<int,_std::allocator<int>_>);
  Model::~Model(&model);
  std::ifstream::~ifstream(&ifs);
  return;
}

Assistant:

void FastText::trainThread(int32_t threadId) {
  std::ifstream ifs(args_->input);
  utils::seek(ifs, threadId * utils::size(ifs) / args_->thread);

  Model model(input_, output_, args_, threadId);
  
  if (args_->model == model_name::sup) {
    model.setTargetCounts(dict_->getCounts(entry_type::label));
  } else {
    model.setTargetCounts(dict_->getCounts(entry_type::word));
  }

  const int64_t ntokens = dict_->ntokens();
  int64_t localTokenCount = 0;
  std::vector<int32_t> line, labels;
  while (tokenCount < args_->epoch * ntokens) {
    real progress = real(tokenCount) / (args_->epoch * ntokens);
    real lr = args_->lr * (1.0 - progress);
    localTokenCount += dict_->getLine(ifs, line, labels, model.rng);
    if (args_->model == model_name::sup) {
      dict_->addNgrams(line, args_->wordNgrams);
      supervised(model, lr, line, labels);
    } else if (args_->model == model_name::cbow) {
      cbow(model, lr, line);
    } else if (args_->model == model_name::sg) {
      skipgram(model, lr, line);
    }
    if (localTokenCount > args_->lrUpdateRate) {
      tokenCount += localTokenCount;
      localTokenCount = 0;
      if (threadId == 0 && args_->verbose > 1) {
        printInfo(progress, model.getLoss());
      }
    }
  }
  if (threadId == 0 && args_->verbose > 0) {
    printInfo(1.0, model.getLoss());
    std::cout << std::endl;
  }
  ifs.close();
}